

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O0

void __thiscall EmmyDebuggerManager::RemoveAllBreakpoints(EmmyDebuggerManager *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  EmmyDebuggerManager *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->breakpointsMtx);
  std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>::clear
            (&this->breakpoints);
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear(&this->lineSet);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void EmmyDebuggerManager::RemoveAllBreakpoints()
{
	std::lock_guard<std::mutex> lock(breakpointsMtx);
	breakpoints.clear();
	lineSet.clear();
}